

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int Ssw_SmlObjsAreEqualWord(Ssw_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  uint *puVar1;
  uint *puVar2;
  int local_3c;
  int i;
  uint *pSims1;
  uint *pSims0;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  Ssw_Sml_t *p_local;
  
  puVar1 = Ssw_ObjSim(p,pObj0->Id);
  puVar2 = Ssw_ObjSim(p,pObj1->Id);
  local_3c = p->nWordsPref;
  while( true ) {
    if (p->nWordsTotal <= local_3c) {
      return 1;
    }
    if (puVar1[local_3c] != puVar2[local_3c]) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Ssw_SmlObjsAreEqualWord( Ssw_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    pSims0 = Ssw_ObjSim(p, pObj0->Id);
    pSims1 = Ssw_ObjSim(p, pObj1->Id);
    for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}